

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::SharedMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  element_type *peVar1;
  recursive_mutex *__mutex;
  Impl *pIVar2;
  bool bVar3;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  std::recursive_mutex::lock(__mutex);
  pIVar2 = this->m_pImpl;
  if (mesh_type == render_mesh) {
    if (pIVar2 == (Impl *)0x0) {
      pIVar2 = (Impl *)0x0;
      goto LAB_004113c0;
    }
LAB_004113b1:
    peVar1 = (pIVar2->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_004113c0;
  }
  else {
    if (mesh_type == preview_mesh) {
LAB_004113ad:
      pIVar2 = (Impl *)&pIVar2->m_preview_mesh;
      goto LAB_004113b1;
    }
    if (mesh_type == analysis_mesh) {
      pIVar2 = (Impl *)&pIVar2->m_analysis_mesh;
      goto LAB_004113b1;
    }
    bVar3 = (pIVar2->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0;
    peVar1 = (&(pIVar2->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
             )[bVar3]._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_004113ad;
    pIVar2 = (Impl *)(&(pIVar2->m_render_mesh).
                       super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> + bVar3);
  }
  peVar1->m_parent = (ON_Object *)this;
LAB_004113c0:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return &pIVar2->m_render_mesh;
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::SharedMesh(ON::mesh_type mesh_type) const
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  std::shared_ptr<const ON_Mesh>* pMesh = nullptr;

  switch (mesh_type)
  {
  case ON::render_mesh:
    pMesh = &m_pImpl->m_render_mesh;
    break;
  case ON::analysis_mesh:
    pMesh = &m_pImpl->m_analysis_mesh;
    break;
  case ON::preview_mesh:
    pMesh = &m_pImpl->m_preview_mesh;
    break;
  default:
    pMesh = m_pImpl->m_render_mesh ? &m_pImpl->m_render_mesh : &m_pImpl->m_analysis_mesh;
    if (pMesh->get() == nullptr)
    {
      pMesh = &m_pImpl->m_preview_mesh;
    }
    break;
  }

  if (pMesh && pMesh->get())
  {
    const_cast<ON_Mesh*>(pMesh->get())->m_parent = this;
  }

  return *pMesh;
}